

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

bool __thiscall
ON_Font::Internal_SetFontCharacteristicsFromUnsigned
          (ON_Font *this,uint font_characteristics_as_unsigned)

{
  bool bVar1;
  wchar_t *gdi_logfont_name;
  undefined1 local_28 [7];
  bool rc;
  ON_wString windows_logfont_name;
  bool local_18;
  Style local_17;
  Stretch local_16;
  Weight local_15;
  uint uStack_14;
  bool bStrikethrough;
  bool bUnderlined;
  Style font_style;
  Stretch font_stretch;
  Weight font_weight;
  uint font_characteristics_as_unsigned_local;
  ON_Font *this_local;
  
  local_15 = Normal;
  local_16 = Medium;
  local_17 = Upright;
  local_18 = false;
  windows_logfont_name.m_s._7_1_ = 0;
  uStack_14 = font_characteristics_as_unsigned;
  _bUnderlined = this;
  Internal_GetFontCharacteristicsFromUnsigned
            (font_characteristics_as_unsigned,&local_15,&local_16,&local_17,&local_18,
             (bool *)((long)&windows_logfont_name.m_s + 7));
  WindowsLogfontName((ON_Font *)local_28);
  gdi_logfont_name = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_28);
  bVar1 = SetFontCharacteristics
                    (this,gdi_logfont_name,local_15,local_17,local_16,(bool)(local_18 & 1),
                     (bool)(windows_logfont_name.m_s._7_1_ & 1));
  ON_wString::~ON_wString((ON_wString *)local_28);
  return bVar1;
}

Assistant:

bool ON_Font::Internal_SetFontCharacteristicsFromUnsigned(
  unsigned int font_characteristics_as_unsigned
  )
{
  ON_Font::Weight font_weight = ON_Font::Weight::Normal;
  ON_Font::Stretch font_stretch = ON_Font::Stretch::Medium;
  ON_Font::Style font_style = ON_Font::Style::Upright;
  bool bUnderlined = false;
  bool bStrikethrough = false;

  ON_Font::Internal_GetFontCharacteristicsFromUnsigned(
    font_characteristics_as_unsigned,
    font_weight,
    font_stretch,
    font_style,
    bUnderlined,
    bStrikethrough
    );


  const ON_wString windows_logfont_name = WindowsLogfontName();

  bool rc = SetFontCharacteristics(
    windows_logfont_name,
    font_weight,
    font_style,
    font_stretch,
    bUnderlined,
    bStrikethrough
  );

  return rc;
}